

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O0

void __thiscall AlsavoSession::AlsavoSession(AlsavoSession *this)

{
  rep rVar1;
  float local_20 [4];
  AlsavoSession *local_10;
  AlsavoSession *this_local;
  
  this->m_ConnectionStatus = Disconnected;
  local_10 = this;
  CLI::std::function<void_(AlsavoSession::ConnectionStatus,_AlsavoSession::ConnectionStatus)>::
  function(&this->m_ConnStatusCB);
  CLI::std::deque<AlsavoSession::PacketQueueItem,_std::allocator<AlsavoSession::PacketQueueItem>_>::
  deque(&this->m_OutQueue);
  CLI::std::function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_int)>
  ::function(&this->m_StatusHandler);
  local_20[0] = 1000.0;
  std::chrono::duration<float,std::ratio<1l,1000l>>::duration<float,void>
            ((duration<float,std::ratio<1l,1000l>> *)&this->m_PacketTimeout,local_20);
  this->m_Sock = 0;
  std::__cxx11::string::string((string *)&this->m_SerialNo);
  std::__cxx11::string::string((string *)&this->m_Password);
  this->m_ClientToken = 0;
  this->m_ServerToken = 0;
  this->m_CSID = 0;
  this->m_DSID = 0;
  this->m_NextSeq = 0;
  this->m_MaxRetries = 3;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->m_LastPacketRcvTime).__d.__r = rVar1;
  CLI::std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_LastConfigReqTime);
  return;
}

Assistant:

AlsavoSession()
		: m_LastPacketRcvTime(std::chrono::system_clock::now())
		, m_ConnectionStatus(ConnectionStatus::Disconnected)
	{
#ifdef _MSC_VER
		WSADATA wsadata;
		WSAStartup(MAKEWORD(2, 2), &wsadata);
#endif
	}